

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressRleLiteralsBlock(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  ulong in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  char *in_RDI;
  U32 flSize;
  BYTE *ostart;
  U32 in_stack_ffffffffffffffcc;
  
  uVar1 = ((uint)(0x1f < in_RCX) - (uint)(in_RCX < 0x1000)) + 2;
  if (uVar1 == 1) {
    *in_RDI = (char)(in_RCX << 3) + '\x01';
  }
  else if (uVar1 == 2) {
    MEM_writeLE16((void *)0x200000002,(U16)(in_stack_ffffffffffffffcc >> 0x10));
  }
  else if (uVar1 == 3) {
    MEM_writeLE32((void *)0x300000003,in_stack_ffffffffffffffcc);
  }
  in_RDI[uVar1] = *(char *)CONCAT71(in_register_00000011,in_DL);
  return (ulong)(uVar1 + 1);
}

Assistant:

static size_t ZSTD_compressRleLiteralsBlock (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE* const)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    (void)dstCapacity;  /* dstCapacity already guaranteed to be >=4, hence large enough */

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_rle + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_rle + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_rle + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ostart[flSize] = *(const BYTE*)src;
    return flSize+1;
}